

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O1

void pretty_print(string *filename)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  string buf;
  string s;
  ifstream f;
  ofstream of;
  string local_498;
  undefined1 *local_478;
  long local_470;
  undefined1 local_468 [16];
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  long local_438 [4];
  int aiStack_418 [122];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_438,(string *)filename,_S_in);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_498,pcVar1,pcVar1 + filename->_M_string_length);
  std::__cxx11::string::append((char *)&local_498);
  std::ofstream::ofstream(&local_230,(string *)&local_498,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_498._M_string_length = 0;
  local_498.field_2._M_local_buf[0] = '\0';
  if (*(int *)((long)aiStack_418 + *(long *)(local_438[0] + -0x18)) == 0) {
    do {
      read_exp((ifstream *)local_438,&local_498);
      local_458[0] = local_448;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_458,local_498._M_dataplus._M_p,
                 local_498._M_dataplus._M_p + local_498._M_string_length);
      util::pprint(&local_478,(string *)local_458);
      if (local_458[0] != local_448) {
        operator_delete(local_458[0]);
      }
      lVar2 = local_470;
      if (local_470 != 0) {
        lVar3 = 0;
        do {
          std::ostream::put((char)&local_230);
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
      if (local_478 != local_468) {
        operator_delete(local_478);
      }
    } while (*(int *)((long)aiStack_418 + *(long *)(local_438[0] + -0x18)) == 0);
  }
  std::ifstream::close();
  std::ofstream::close();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  std::ifstream::~ifstream(local_438);
  return;
}

Assistant:

void pretty_print(const std::string &filename) {

  std::ifstream f(filename);
  std::ofstream of(filename + "___");
  std::string buf;

  while (f.good()) {
    read_exp(f, buf);
    std::string s = util::pprint(buf);
    for (auto d : s) {
      of.put(d);
    }
  }

  f.close();
  of.close();

}